

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

int websocket_write(ws_s *ws,fio_str_info_s msg,uint8_t is_text)

{
  int iVar1;
  uint8_t is_text_local;
  ws_s *ws_local;
  
  iVar1 = fio_is_valid(ws->fd);
  if (iVar1 == 0) {
    ws_local._4_4_ = -1;
  }
  else {
    websocket_write_impl(ws->fd,msg.data,msg.len,is_text,'\x01','\x01',ws->is_client);
    ws_local._4_4_ = 0;
  }
  return ws_local._4_4_;
}

Assistant:

int websocket_write(ws_s *ws, fio_str_info_s msg, uint8_t is_text) {
  if (fio_is_valid(ws->fd)) {
    websocket_write_impl(ws->fd, msg.data, msg.len, is_text, 1, 1,
                         ws->is_client);
    return 0;
  }
  return -1;
}